

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O2

JavascriptString *
Js::WebAssemblyModule::GetExternalKindString(ScriptContext *scriptContext,ExternalKinds kind)

{
  code *pcVar1;
  bool bVar2;
  JavascriptString *pJVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000031;
  char16 (*value) [7];
  JavascriptLibrary *this;
  
  switch(CONCAT71(in_register_00000031,kind) & 0xffffffff) {
  case 0:
    pJVar3 = JavascriptLibrary::CreateStringFromCppLiteral<9ul>
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                        (char16 (*) [9])0xf2ca26);
    return pJVar3;
  case 1:
    pJVar3 = JavascriptLibrary::CreateStringFromCppLiteral<6ul>
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                        (char16 (*) [6])0xe03a64);
    return pJVar3;
  case 2:
    this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    value = (char16 (*) [7])0xff7b0c;
    break;
  case 3:
    this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
    value = (char16 (*) [7])0x100ad44;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x3b8,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    return (JavascriptString *)0x0;
  }
  pJVar3 = JavascriptLibrary::CreateStringFromCppLiteral<7ul>(this,value);
  return pJVar3;
}

Assistant:

JavascriptString *
WebAssemblyModule::GetExternalKindString(ScriptContext * scriptContext, Wasm::ExternalKinds kind)
{
    switch (kind)
    {
    case Wasm::ExternalKinds::Function:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("function"));
    case Wasm::ExternalKinds::Table:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("table"));
    case Wasm::ExternalKinds::Memory:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("memory"));
    case Wasm::ExternalKinds::Global:
        return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("global"));
    default:
        Assume(UNREACHED);
    }
    return nullptr;
}